

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void opj_v4dwt_decode(opj_v4dwt_t *dwt)

{
  opj_v4_t *w;
  opj_v4_t *w_00;
  int iVar1;
  OPJ_UINT32 start;
  OPJ_UINT32 end;
  OPJ_UINT32 start_00;
  OPJ_UINT32 end_00;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 m;
  OPJ_UINT32 m_00;
  int iVar4;
  int iVar5;
  opj_v4_t *w_01;
  opj_v4_t *poVar6;
  undefined8 in_XMM1_Qa;
  __m128 c;
  __m128 c_00;
  __m128 c_01;
  __m128 c_02;
  __m128 c_03;
  __m128 c_04;
  
  if (dwt->cas == 0) {
    iVar5 = 1;
    iVar4 = 0;
    if (0 < dwt->dn) goto LAB_0010d603;
    iVar1 = dwt->sn;
  }
  else {
    iVar5 = 0;
    iVar4 = 1;
    if (0 < dwt->sn) goto LAB_0010d603;
    iVar1 = dwt->dn;
    iVar5 = 0;
  }
  if (iVar1 < 2) {
    return;
  }
LAB_0010d603:
  poVar6 = dwt->wavelet;
  w = (opj_v4_t *)((long)poVar6 + (ulong)(uint)(iVar4 << 4));
  start = dwt->win_l_x0;
  end = dwt->win_l_x1;
  c._8_8_ = in_XMM1_Qa;
  c[0] = 1.2301741;
  c[1] = 1.2301741;
  opj_v4dwt_decode_step1_sse(w,start,end,c);
  w_00 = (opj_v4_t *)((long)poVar6 + (ulong)(uint)(iVar5 << 4));
  start_00 = dwt->win_h_x0;
  end_00 = dwt->win_h_x1;
  c_00[2] = (float)(int)in_XMM1_Qa;
  c_00[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  c_00[0] = 1.6257324;
  c_00[1] = 1.6257324;
  opj_v4dwt_decode_step1_sse(w_00,start_00,end_00,c_00);
  w_01 = (opj_v4_t *)((long)poVar6 + (ulong)(uint)(iVar4 << 4) + 0x10);
  OVar2 = dwt->dn;
  OVar3 = dwt->sn;
  m = OVar2 - iVar4;
  if ((int)OVar3 < (int)(OVar2 - iVar4)) {
    m = OVar3;
  }
  c_01[2] = (float)(int)in_XMM1_Qa;
  c_01[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  c_01[0] = -0.44350687;
  c_01[1] = -0.44350687;
  opj_v4dwt_decode_step2_sse(w_00,w_01,start,end,m,c_01);
  poVar6 = (opj_v4_t *)((long)poVar6 + (ulong)(uint)(iVar5 << 4) + 0x10);
  m_00 = OVar3 - iVar5;
  if ((int)OVar2 < (int)(OVar3 - iVar5)) {
    m_00 = OVar2;
  }
  c_02[2] = (float)(int)in_XMM1_Qa;
  c_02[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  c_02[0] = -0.8829111;
  c_02[1] = -0.8829111;
  opj_v4dwt_decode_step2_sse(w,poVar6,start_00,end_00,m_00,c_02);
  c_03[2] = (float)(int)in_XMM1_Qa;
  c_03[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  c_03[0] = 0.052980117;
  c_03[1] = 0.052980117;
  opj_v4dwt_decode_step2_sse(w_00,w_01,start,end,m,c_03);
  c_04[2] = (float)(int)in_XMM1_Qa;
  c_04[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  c_04[0] = 1.5861343;
  c_04[1] = 1.5861343;
  opj_v4dwt_decode_step2_sse(w,poVar6,start_00,end_00,m_00,c_04);
  return;
}

Assistant:

static void opj_v4dwt_decode(opj_v4dwt_t* OPJ_RESTRICT dwt)
{
    OPJ_INT32 a, b;
    if (dwt->cas == 0) {
        if (!((dwt->dn > 0) || (dwt->sn > 1))) {
            return;
        }
        a = 0;
        b = 1;
    } else {
        if (!((dwt->sn > 0) || (dwt->dn > 1))) {
            return;
        }
        a = 1;
        b = 0;
    }
#ifdef __SSE__
    opj_v4dwt_decode_step1_sse(dwt->wavelet + a, dwt->win_l_x0, dwt->win_l_x1,
                               _mm_set1_ps(opj_K));
    opj_v4dwt_decode_step1_sse(dwt->wavelet + b, dwt->win_h_x0, dwt->win_h_x1,
                               _mm_set1_ps(opj_c13318));
    opj_v4dwt_decode_step2_sse(dwt->wavelet + b, dwt->wavelet + a + 1,
                               dwt->win_l_x0, dwt->win_l_x1,
                               (OPJ_UINT32)opj_int_min(dwt->sn, dwt->dn - a),
                               _mm_set1_ps(opj_dwt_delta));
    opj_v4dwt_decode_step2_sse(dwt->wavelet + a, dwt->wavelet + b + 1,
                               dwt->win_h_x0, dwt->win_h_x1,
                               (OPJ_UINT32)opj_int_min(dwt->dn, dwt->sn - b),
                               _mm_set1_ps(opj_dwt_gamma));
    opj_v4dwt_decode_step2_sse(dwt->wavelet + b, dwt->wavelet + a + 1,
                               dwt->win_l_x0, dwt->win_l_x1,
                               (OPJ_UINT32)opj_int_min(dwt->sn, dwt->dn - a),
                               _mm_set1_ps(opj_dwt_beta));
    opj_v4dwt_decode_step2_sse(dwt->wavelet + a, dwt->wavelet + b + 1,
                               dwt->win_h_x0, dwt->win_h_x1,
                               (OPJ_UINT32)opj_int_min(dwt->dn, dwt->sn - b),
                               _mm_set1_ps(opj_dwt_alpha));
#else
    opj_v4dwt_decode_step1(dwt->wavelet + a, dwt->win_l_x0, dwt->win_l_x1,
                           opj_K);
    opj_v4dwt_decode_step1(dwt->wavelet + b, dwt->win_h_x0, dwt->win_h_x1,
                           opj_c13318);
    opj_v4dwt_decode_step2(dwt->wavelet + b, dwt->wavelet + a + 1,
                           dwt->win_l_x0, dwt->win_l_x1,
                           (OPJ_UINT32)opj_int_min(dwt->sn, dwt->dn - a),
                           opj_dwt_delta);
    opj_v4dwt_decode_step2(dwt->wavelet + a, dwt->wavelet + b + 1,
                           dwt->win_h_x0, dwt->win_h_x1,
                           (OPJ_UINT32)opj_int_min(dwt->dn, dwt->sn - b),
                           opj_dwt_gamma);
    opj_v4dwt_decode_step2(dwt->wavelet + b, dwt->wavelet + a + 1,
                           dwt->win_l_x0, dwt->win_l_x1,
                           (OPJ_UINT32)opj_int_min(dwt->sn, dwt->dn - a),
                           opj_dwt_beta);
    opj_v4dwt_decode_step2(dwt->wavelet + a, dwt->wavelet + b + 1,
                           dwt->win_h_x0, dwt->win_h_x1,
                           (OPJ_UINT32)opj_int_min(dwt->dn, dwt->sn - b),
                           opj_dwt_alpha);
#endif
}